

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char>(string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char *args)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  char local_58 [32];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_t local_28;
  char *pcStack_20;
  undefined8 local_18;
  char *local_10;
  
  local_38._M_len = (a->View_)._M_len;
  local_38._M_str = (a->View_)._M_str;
  local_28 = (b->View_)._M_len;
  pcStack_20 = (b->View_)._M_str;
  local_58[0] = *args;
  local_10 = local_58;
  local_18 = 1;
  views._M_len = 3;
  views._M_array = &local_38;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}